

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryGetParent(InMemoryDirectory *this,StringPtr name)

{
  Disposer *extraout_RAX;
  ReadableDirectory *extraout_RDX;
  Mutex *this_00;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock_00;
  EntryImpl *entry;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> OVar1;
  StringPtr name_00;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Mutex *local_60;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_58;
  Clock *local_48;
  undefined1 local_40 [16];
  
  name_00.content.size_ = name.content.size_;
  lock_00 = (Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)name.content.ptr;
  this_00 = (Mutex *)&lock_00[1].ptr;
  local_40[0] = '\0';
  kj::_::Mutex::lock(this_00,1,local_40);
  local_40[0] = '\0';
  local_60 = this_00;
  local_58 = lock_00 + 3;
  kj::_::Mutex::lock(this_00,1,local_40);
  name_00.content.ptr = (char *)(lock_00 + 3);
  Impl::tryGetEntry((Impl *)&local_48,name_00);
  kj::_::Mutex::unlock(this_00,SHARED,(Waiter *)0x0);
  if (local_48 == (Clock *)0x0) {
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  }
  else {
    OVar1 = (Own<const_kj::ReadableDirectory,_std::nullptr_t>)
            asDirectory(this,lock_00,(EntryImpl *)&local_60);
    this_00 = local_60;
    if (local_60 == (Mutex *)0x0) {
      return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)OVar1;
    }
  }
  kj::_::Mutex::unlock(this_00,SHARED,(Waiter *)0x0);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = extraout_RAX;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)OVar1;
}

Assistant:

kj::Maybe<Own<const ReadableDirectory>> tryGetParent(kj::StringPtr name) const {
    auto lock = impl.lockShared();
    KJ_IF_SOME(entry, impl.lockShared()->tryGetEntry(name)) {
      return asDirectory(lock, entry);
    } else {
      return kj::none;
    }
  }